

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O3

int __thiscall SocketClient::init(SocketClient *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint __domain;
  int iVar5;
  EventLoop *pEVar6;
  SharedPtr loop;
  EventLoop *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  uVar4 = (uint)ctx;
  uVar2 = uVar4 & 7;
  if (uVar2 == 1) {
    __domain = uVar4 & 8 | 2;
    iVar3 = 1;
  }
  else if (uVar2 == 4) {
    __domain = 1;
    iVar3 = 1;
    if (((ulong)ctx & 8) != 0) {
      __assert_fail("!(mode & IPv6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x309,"bool SocketClient::init(unsigned int)");
    }
  }
  else {
    __domain = 0xffffffff;
    iVar3 = -1;
    if (uVar2 == 2) {
      __domain = uVar4 & 8 | 2;
      iVar3 = 2;
    }
  }
  iVar5 = 0;
  iVar3 = socket(__domain,iVar3,0);
  this->mFd = iVar3;
  if (-1 < iVar3) {
    setFlags(iVar3,1,1,2,FlagAppend);
    pEVar6 = (EventLoop *)0x0;
    if (this->mBlocking == false) {
      EventLoop::eventLoop();
      if (local_50 != (EventLoop *)0x0) {
        iVar3 = this->mFd;
        local_40._8_8_ = 0;
        local_40._M_unused._M_object = operator_new(0x18);
        *(code **)local_40._M_unused._0_8_ = socketCallback;
        *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
        *(SocketClient **)((long)local_40._M_unused._0_8_ + 0x10) = this;
        local_28 = std::
                   _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(SocketClient::*(SocketClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                   ::_M_invoke;
        local_30 = std::
                   _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(SocketClient::*(SocketClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                   ::_M_manager;
        EventLoop::registerSocket(local_50,iVar3,1,(function<void_(int,_unsigned_int)> *)&local_40);
        if (local_30 != (code *)0x0) {
          (*local_30)(&local_40,&local_40,__destroy_functor);
        }
        iVar3 = 0x800;
        bVar1 = setFlags(this->mFd,0x800,3,4,FlagAppend);
        if (!bVar1) {
          close(this,iVar3);
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          return 0;
        }
      }
      pEVar6 = local_50;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
    }
    this->mSocketMode = uVar4;
    iVar5 = (int)CONCAT71((int7)((ulong)pEVar6 >> 8),1);
  }
  return iVar5;
}

Assistant:

bool SocketClient::init(unsigned int mode)
{
    int domain = -1, type = -1;
    switch (mode & (Udp|Tcp|Unix)) {
    case Udp:
        type = SOCK_DGRAM;
        domain = (mode & IPv6) ? AF_INET6 : AF_INET;
        break;
    case Tcp:
        type = SOCK_STREAM;
        domain = (mode & IPv6) ? AF_INET6 : AF_INET;
        break;
    case Unix:
        type = SOCK_STREAM;
        assert(!(mode & IPv6));
        domain = PF_UNIX;
        break;
    }

    mFd = ::socket(domain, type, 0);
    if (mFd < 0) {
        // bad
        return false;
    }
#ifdef HAVE_NOSIGPIPE
    int flags = 1;
    ::setsockopt(mFd, SOL_SOCKET, SO_NOSIGPIPE, (void *)&flags, sizeof(int));
#endif
#ifdef HAVE_CLOEXEC
    setFlags(mFd, FD_CLOEXEC, F_GETFD, F_SETFD);
#endif

    if (!mBlocking) {
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->registerSocket(mFd, EventLoop::SocketRead,
                                 std::bind(&SocketClient::socketCallback, this, std::placeholders::_1, std::placeholders::_2));
#ifndef _WIN32   // no O_NONBLOCK on windows
            if (!setFlags(mFd, O_NONBLOCK, F_GETFL, F_SETFL)) {
                close();
                return false;
            }
#endif
        }
    }

    mSocketMode = mode;
    return true;
}